

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cash.cpp
# Opt level: O3

void __thiscall Cash::display(Cash *this)

{
  long lVar1;
  ostream *poVar2;
  
  Transaction::display(&this->super_Transaction);
  lVar1 = std::cout;
  *(uint *)(std::__cxx11::string::_M_replace + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::_M_replace + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tPayment Method: Cash",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tAmount Paid: $",0xf);
  poVar2 = std::ostream::_M_insert<double>(this->totalPaid);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tChange due: $",0xe);
  poVar2 = std::ostream::_M_insert<double>(this->changeDue);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Cash::display() const
{
    Transaction::display();

    cout << fixed << setprecision(2) << "\tPayment Method: Cash" << endl << "\tAmount Paid: $" << totalPaid << endl << "\tChange due: $" << changeDue << endl;
}